

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O1

void __thiscall VariablePattern::advance(VariablePattern *this,int t)

{
  pointer piVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  piVar1 = (this->times).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->times).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
  iVar3 = (this->super_Pattern).currentIndex + -1;
  do {
    uVar4 = (ulong)(iVar3 + 2);
    if (uVar2 <= uVar4) goto LAB_0012d24a;
    iVar3 = iVar3 + 1;
  } while (piVar1[uVar4] <= t);
  if (uVar2 <= uVar4) {
LAB_0012d24a:
    iVar3 = (int)uVar2 + -1;
  }
  (this->super_Pattern).currentIndex = iVar3;
  return;
}

Assistant:

void VariablePattern::advance(int t)
{
    for (unsigned int i = currentIndex+1; i < times.size(); i++)
    {
        if ( t < times[i] )
        {
            currentIndex = i-1;
            return;
        }
    }
    currentIndex = times.size() - 1;
}